

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dns_resolver_sync.c
# Opt level: O0

_Bool dns_resolver_is_lookup_complete(DNSRESOLVER_HANDLE dns_in)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  undefined1 local_78 [4];
  int getAddrResult;
  addrinfo hints;
  addrinfo *ptr;
  addrinfo *addrInfo;
  char portString [16];
  LOGGER_LOG l;
  _Bool result;
  DNSRESOLVER_INSTANCE *dns;
  DNSRESOLVER_HANDLE dns_in_local;
  
  if (dns_in == (DNSRESOLVER_HANDLE)0x0) {
    portString._8_8_ = xlogging_get_log_function();
    if ((LOGGER_LOG)portString._8_8_ != (LOGGER_LOG)0x0) {
      (*(code *)portString._8_8_)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                 ,"dns_resolver_is_lookup_complete",0x5a,1,"NULL dns");
    }
    l._7_1_ = false;
  }
  else {
    if ((*(byte *)((long)dns_in + 0x10) & 1) == 0) {
      ptr = (addrinfo *)0x0;
      hints.ai_next = (addrinfo *)0x0;
      memset(local_78,0,0x30);
      getAddrResult = 2;
      hints.ai_flags = 1;
      hints.ai_family = 0;
      iVar1 = sprintf((char *)&addrInfo,"%u",(ulong)*(uint *)((long)dns_in + 8));
      if ((iVar1 < 0) && (p_Var2 = xlogging_get_log_function(), p_Var2 != (LOGGER_LOG)0x0)) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                  ,"dns_resolver_is_lookup_complete",0x7f,1,
                  "Failure: sprintf failed to encode the port.");
      }
      iVar1 = getaddrinfo(*dns_in,(char *)&addrInfo,(addrinfo *)local_78,(addrinfo **)&ptr);
      if (iVar1 == 0) {
        *(addrinfo **)((long)dns_in + 0x18) = ptr;
        for (hints.ai_next = ptr; hints.ai_next != (addrinfo *)0x0;
            hints.ai_next = (hints.ai_next)->ai_next) {
          if ((hints.ai_next)->ai_family == 2) {
            *(undefined4 *)((long)dns_in + 0xc) =
                 *(undefined4 *)((hints.ai_next)->ai_addr->sa_data + 2);
            *(undefined1 *)((long)dns_in + 0x11) = 0;
          }
        }
        *(bool *)((long)dns_in + 0x11) = *(int *)((long)dns_in + 0xc) == 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/deps/c-utility/src/dns_resolver_sync.c"
                    ,"dns_resolver_is_lookup_complete",0xa5,1,"Failed DNS lookup for %s: %d",*dns_in
                    ,iVar1);
        }
        *(undefined1 *)((long)dns_in + 0x11) = 1;
      }
      *(undefined1 *)((long)dns_in + 0x10) = 1;
    }
    l._7_1_ = true;
  }
  return l._7_1_;
}

Assistant:

bool dns_resolver_is_lookup_complete(DNSRESOLVER_HANDLE dns_in)
{
    DNSRESOLVER_INSTANCE* dns = (DNSRESOLVER_INSTANCE*)dns_in;

    bool result;
    if (dns == NULL)
    {
        /* Codes_SRS_dns_resolver_30_020: [ If the dns parameter is NULL, dns_resolver_is_create_complete shall log an error and return false. ]*/
        LogError("NULL dns");
        result = false;
    }
    else
    {
        if (dns->is_complete)
        {
            /* Codes_SRS_dns_resolver_30_024: [ If dns_resolver_is_create_complete has previously returned true, dns_resolver_is_create_complete shall do nothing and return true. ]*/
            result = true;
        }
        else
        {
            char portString[16];
            struct addrinfo *addrInfo = NULL;
            struct addrinfo *ptr = NULL;
            struct addrinfo hints;
            int getAddrResult;

            //--------------------------------
            // Setup the hints address info structure
            // which is passed to the getaddrinfo() function
            memset(&hints, 0, sizeof(hints));
#ifdef IPV6_ENABLED
            hints.ai_family = AF_UNSPEC;
#else
            hints.ai_family = AF_INET;
#endif // IPV6_ENABLED
            hints.ai_socktype = SOCK_STREAM;
            hints.ai_protocol = 0;

            //--------------------------------
            // Call getaddrinfo(). If the call succeeds,
            // the result variable will hold a linked list
            // of addrinfo structures containing response
            // information
            if (sprintf(portString, "%u", dns->port) < 0)
            {
                LogError("Failure: sprintf failed to encode the port.");
                result = MU_FAILURE;
            }

            getAddrResult = getaddrinfo(dns->hostname, portString, &hints, &addrInfo);
            if (getAddrResult == 0)
            {
                dns->addrInfo = addrInfo;
                
                // If we find the AF_INET address, use it as the return value
                for (ptr = addrInfo; ptr != NULL; ptr = ptr->ai_next)
                {
                    switch (ptr->ai_family)
                    {
                    case AF_INET:
                        /* Codes_SRS_dns_resolver_30_032: [ If dns_resolver_is_create_complete has returned true and the lookup process has succeeded, dns_resolver_get_ipv4 shall return the discovered IPv4 address. ]*/
                        dns->ip_v4 = EXTRACT_IPV4(ptr);
                        dns->is_failed = false;
                        break;
#ifdef IPV6_ENABLED
                    case AF_INET6:
                        memcpy(dns->ip_v6, EXTRACT_IPV6(ptr), 16);
                        dns->is_failed = false;
                        break;     
#endif // IPV6_ENABLED
                    }
                }
                /* Codes_SRS_dns_resolver_30_033: [ If dns_resolver_is_create_complete has returned true and the lookup process has failed, dns_resolver_get_ipv4 shall return 0. ]*/
#ifdef IPV6_ENABLED
                uint8_t zero[16] = { 0 }; // IPv6 address of all zeroes
                dns->is_failed = (dns->ip_v4 == 0) && (memcmp(dns->ip_v6, zero, 16) == 0);
#else
                dns->is_failed = (dns->ip_v4 == 0);
#endif // IPV6_ENABLED
            }
            else
            {
                /* Codes_SRS_dns_resolver_30_033: [ If dns_resolver_is_create_complete has returned true and the lookup process has failed, dns_resolver_get_ipv4 shall return 0. ]*/
                LogInfo("Failed DNS lookup for %s: %d", dns->hostname, getAddrResult);
                dns->is_failed = true;
            }

            /* Codes_SRS_dns_resolver_30_021: [ dns_resolver_is_create_complete shall perform the asynchronous work of DNS lookup and log any errors. ]*/
            // Only make one attempt at lookup for this
            // synchronous implementation
            dns->is_complete = true;

            // This synchronous implementation is incapable of being incomplete, so SRS_dns_resolver_30_023 does not ever happen
            /* Codes_SRS_dns_resolver_30_023: [ If the DNS lookup process is not yet complete, dns_resolver_is_create_complete shall return false. ]*/
            /* Codes_SRS_dns_resolver_30_022: [ If the DNS lookup process has completed, dns_resolver_is_create_complete shall return true. ]*/
            result = true;
        }
    }

    return result;
}